

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ClockReceiver.hpp
# Opt level: O3

void __thiscall
MOS::MOS6526::MOS6526<Amiga::Chipset::CIABHandler,_(MOS::MOS6526::Personality)1>::run_for
          (MOS6526<Amiga::Chipset::CIABHandler,_(MOS::MOS6526::Personality)1> *this,
          HalfCycles half_cycles)

{
  uint8_t *puVar1;
  int *piVar2;
  bool bVar3;
  bool bVar4;
  byte bVar5;
  ulong uVar6;
  uint uVar7;
  ulong uVar8;
  
  uVar6 = (long)half_cycles.super_WrappedInt<HalfCycles>.length_ +
          (this->super_MOS6526Storage).half_divider_.super_WrappedInt<HalfCycles>.length_;
  (this->super_MOS6526Storage).half_divider_.super_WrappedInt<HalfCycles>.length_ =
       (ulong)((uint)uVar6 & 1);
  if (1 < uVar6) {
    uVar6 = (long)uVar6 >> 1;
    if (0x7ffffffe < (long)uVar6) {
      uVar6 = 0x7fffffff;
    }
    uVar8 = 0xffffffff80000000;
    if (-0x80000000 < (long)uVar6) {
      uVar8 = uVar6;
    }
    do {
      uVar7 = (this->super_MOS6526Storage).pending_;
      if ((uVar7 & 1) != 0) {
        puVar1 = &(this->super_MOS6526Storage).interrupt_state_;
        *puVar1 = *puVar1 | 0x80;
      }
      (this->super_MOS6526Storage).pending_ = uVar7 * 2 & 0xfffffffc;
      bVar3 = MOS6526Storage::Counter::advance<false>
                        ((this->super_MOS6526Storage).counter_,false,
                         (this->super_MOS6526Storage).cnt_state_,
                         (this->super_MOS6526Storage).cnt_edge_);
      bVar4 = MOS6526Storage::Counter::advance<true>
                        ((this->super_MOS6526Storage).counter_ + 1,
                         ((this->super_MOS6526Storage).counter_[1].control & 0x60) == 0x40 && bVar3,
                         (this->super_MOS6526Storage).cnt_state_,
                         (this->super_MOS6526Storage).cnt_edge_);
      bVar5 = bVar4 * '\x02' | bVar3;
      if ((bVar5 != 0) &&
         (bVar5 = bVar5 | (this->super_MOS6526Storage).interrupt_state_,
         (this->super_MOS6526Storage).interrupt_state_ = bVar5,
         ((this->super_MOS6526Storage).interrupt_control_ & bVar5) != 0)) {
        piVar2 = &(this->super_MOS6526Storage).pending_;
        *(byte *)piVar2 = (byte)*piVar2 | 1;
      }
      (this->super_MOS6526Storage).cnt_edge_ = false;
      uVar7 = (int)uVar8 - 1;
      uVar8 = (ulong)uVar7;
    } while (uVar7 != 0);
  }
  return;
}

Assistant:

forceinline T &operator +=(const T &rhs) {
			length_ += rhs.length_;
			return *static_cast<T *>(this);
		}